

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode cr_eob_init(Curl_easy *data,Curl_creader *reader)

{
  void *pvVar1;
  cr_eob_ctx *ctx;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  *(undefined8 *)((long)pvVar1 + 0x60) = 2;
  Curl_bufq_init2((bufq *)((long)pvVar1 + 0x20),0x4000,1,1);
  return CURLE_OK;
}

Assistant:

static CURLcode cr_eob_init(struct Curl_easy *data,
                            struct Curl_creader *reader)
{
  struct cr_eob_ctx *ctx = reader->ctx;
  (void)data;
  /* The first char we read is the first on a line, as if we had
   * read CRLF just before */
  ctx->n_eob = 2;
  Curl_bufq_init2(&ctx->buf, (16 * 1024), 1, BUFQ_OPT_SOFT_LIMIT);
  return CURLE_OK;
}